

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

treeNode * simpleExp(void)

{
  bool bVar1;
  treeNode *ptVar2;
  bool local_b2;
  string local_a0;
  treeNode *local_80;
  treeNode *ret;
  string local_70;
  allocator local_39;
  string local_38;
  treeNode *local_18;
  treeNode *pterm;
  
  local_18 = term();
  std::allocator<char>::allocator();
  ret._6_1_ = 0;
  ret._5_1_ = 0;
  std::__cxx11::string::string((string *)&local_38,"+",&local_39);
  bVar1 = match(&local_38,Empty);
  local_b2 = true;
  if (!bVar1) {
    std::allocator<char>::allocator();
    ret._6_1_ = 1;
    std::__cxx11::string::string((string *)&local_70,"-",(allocator *)((long)&ret + 7));
    ret._5_1_ = 1;
    local_b2 = match(&local_70,Empty);
  }
  if ((ret._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((ret._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&ret + 7));
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (local_b2 == false) {
    pterm = local_18;
  }
  else {
    ptVar2 = (treeNode *)operator_new(0x58);
    treeNode::treeNode(ptVar2,expression);
    ptVar2->child[0] = local_18;
    local_80 = ptVar2;
    ptVar2 = (treeNode *)operator_new(0x58);
    std::__cxx11::string::string((string *)&local_a0,(string *)&preToken.text);
    treeNode::treeNode(ptVar2,opExp,&local_a0);
    local_80->child[1] = ptVar2;
    std::__cxx11::string::~string((string *)&local_a0);
    ptVar2 = simpleExp();
    local_80->child[2] = ptVar2;
    pterm = local_80;
  }
  return pterm;
}

Assistant:

treeNode* simpleExp()
{
    auto pterm=term();
    if(match("+")||match("-"))
    {
        treeNode* ret=new treeNode(NodeKind::expression);
        ret->child[0]=pterm;
        ret->child[1]=new treeNode(ExpKind::opExp,preToken.text);
        ret->child[2]=simpleExp();
        return ret;
    }
    else
    {
        return pterm;
    }
}